

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hungarian_algorithm.h
# Opt level: O0

void __thiscall
hungarian_algorithm::
HungarianSolver<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_unsigned_long,_std::less<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>_>
::HungarianSolver(HungarianSolver<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_unsigned_long,_std::less<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>_>
                  *this,unsigned_long num_rows,unsigned_long num_cols,
                 less<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_> *cost_comparator,
                 duration<long,_boost::ratio<1L,_1L>_> *zero_cost)

{
  long lVar1;
  long lVar2;
  value_type *__value;
  allocator<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_> local_31;
  value_type *local_30;
  duration<long,_boost::ratio<1L,_1L>_> *zero_cost_local;
  less<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_> *cost_comparator_local;
  unsigned_long num_cols_local;
  unsigned_long num_rows_local;
  HungarianSolver<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_unsigned_long,_std::less<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>_>
  *this_local;
  
  local_30 = zero_cost;
  zero_cost_local = (duration<long,_boost::ratio<1L,_1L>_> *)cost_comparator;
  cost_comparator_local = (less<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_> *)num_cols;
  num_cols_local = num_rows;
  num_rows_local = (unsigned_long)this;
  hungarian_algorithm::HungarianSolverBase::HungarianSolverBase
            (&this->super_HungarianSolverBase,num_rows,num_cols);
  __value = local_30;
  this->cost_comparator_ =
       (less<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_> *)zero_cost_local;
  (this->zero_cost_).rep_ = local_30->rep_;
  lVar1 = *(long *)this;
  lVar2 = *(long *)&this->field_0x8;
  std::allocator<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>::allocator(&local_31);
  std::
  vector<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_std::allocator<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>_>
  ::vector(&this->cost_matrix_,lVar1 * lVar2,__value,&local_31);
  std::allocator<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>::~allocator(&local_31);
  return;
}

Assistant:

HungarianSolver(const Size num_rows, const Size num_cols, const CostComparator& cost_comparator,
                  const Cost& zero_cost)
    : HungarianSolverBase(static_cast<std::size_t>(num_rows), static_cast<std::size_t>(num_cols)),
      cost_comparator_(cost_comparator), zero_cost_(zero_cost), cost_matrix_(num_rows_ * num_cols_, zero_cost)
  {
    if (num_rows < 0 || num_cols < 0)
    {
      throw std::invalid_argument("Hungarian algorithm: num_rows and num_cols must be non-negative");
    }
  }